

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeReshapeLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  undefined8 uVar1;
  int iVar2;
  string *psVar3;
  mapped_type *this_00;
  mapped_type *this_01;
  ReshapeLayerParams *from;
  ShapeRange *pSVar4;
  ShapeRange *other;
  size_t sVar5;
  ShapeRange local_a8;
  ShapeRange local_88;
  undefined1 local_58 [8];
  ReshapeLayerParams reshape;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar3);
  reshape._40_8_ = this_01;
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(this_01,psVar3);
  from = Specification::NeuralNetworkLayer::reshape(specLayer);
  Specification::ReshapeLayerParams::ReshapeLayerParams((ReshapeLayerParams *)local_58,from);
  uVar1 = reshape._40_8_;
  pSVar4 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)uVar1,pSVar4);
  iVar2 = Specification::ReshapeLayerParams::targetshape_size((ReshapeLayerParams *)local_58);
  uVar1 = reshape._40_8_;
  if (iVar2 == 3) {
    pSVar4 = ShapeConstraint::sequenceRange((ShapeConstraint *)reshape._40_8_);
    other = ShapeConstraint::sequenceRange(this_00);
    ShapeRange::intersect(&local_88,pSVar4,other);
    ShapeConstraint::updateSequenceRange((ShapeConstraint *)uVar1,&local_88);
    uVar1 = reshape._40_8_;
    sVar5 = Specification::ReshapeLayerParams::targetshape((ReshapeLayerParams *)local_58,0);
    ShapeConstraint::setChannel((ShapeConstraint *)uVar1,sVar5);
    uVar1 = reshape._40_8_;
    sVar5 = Specification::ReshapeLayerParams::targetshape((ReshapeLayerParams *)local_58,1);
    ShapeConstraint::setHeight((ShapeConstraint *)uVar1,sVar5);
    uVar1 = reshape._40_8_;
    sVar5 = Specification::ReshapeLayerParams::targetshape((ReshapeLayerParams *)local_58,2);
    ShapeConstraint::setWidth((ShapeConstraint *)uVar1,sVar5);
  }
  else {
    sVar5 = Specification::ReshapeLayerParams::targetshape((ReshapeLayerParams *)local_58,0);
    ShapeRange::ShapeRange(&local_a8,sVar5);
    ShapeConstraint::updateSequenceRange((ShapeConstraint *)uVar1,&local_a8);
    uVar1 = reshape._40_8_;
    sVar5 = Specification::ReshapeLayerParams::targetshape((ReshapeLayerParams *)local_58,1);
    ShapeConstraint::setChannel((ShapeConstraint *)uVar1,sVar5);
    uVar1 = reshape._40_8_;
    sVar5 = Specification::ReshapeLayerParams::targetshape((ReshapeLayerParams *)local_58,2);
    ShapeConstraint::setHeight((ShapeConstraint *)uVar1,sVar5);
    uVar1 = reshape._40_8_;
    sVar5 = Specification::ReshapeLayerParams::targetshape((ReshapeLayerParams *)local_58,3);
    ShapeConstraint::setWidth((ShapeConstraint *)uVar1,sVar5);
  }
  Specification::ReshapeLayerParams::~ReshapeLayerParams((ReshapeLayerParams *)local_58);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeReshapeLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reshape layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reshape layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // TODO: there is some cross shape constraint here -- all 3 or 4 input ranges might be unconstrained, but now they are constrained to a combination whose product is
    // equal to the product of the output shapes

    Specification::ReshapeLayerParams reshape = specLayer.reshape();

    outputShape.updateBatchRange(inputShape.batchRange());

    if (reshape.targetshape_size() == 3) {
        outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
        outputShape.setChannel(static_cast<size_t>(reshape.targetshape(0)));
        outputShape.setHeight(static_cast<size_t>(reshape.targetshape(1)));
        outputShape.setWidth(static_cast<size_t>(reshape.targetshape(2)));
    } else {
        outputShape.updateSequenceRange(static_cast<size_t>(reshape.targetshape(0)));
        outputShape.setChannel(static_cast<size_t>(reshape.targetshape(1)));
        outputShape.setHeight(static_cast<size_t>(reshape.targetshape(2)));
        outputShape.setWidth(static_cast<size_t>(reshape.targetshape(3)));
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reshape layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reshape layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}